

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

istream * nlohmann::operator>>
                    (istream *i,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  value_t vVar1;
  json_value jVar2;
  undefined1 local_e8 [216];
  
  local_e8._16_8_ = (void *)0x0;
  local_e8._24_8_ = (_Manager_type)0x0;
  local_e8._32_8_ = (_Invoker_type)0x0;
  local_e8._40_8_ = 0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parser::parser((parser *)(local_e8 + 0x30),i,(parser_callback_t *)(local_e8 + 0x10));
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parser::parse((parser *)local_e8);
  vVar1 = j->m_type;
  j->m_type = local_e8[0];
  jVar2 = j->m_value;
  j->m_value = (json_value)local_e8._8_8_;
  local_e8[0] = vVar1;
  local_e8._8_8_ = jVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_e8);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parser::~parser((parser *)(local_e8 + 0x30));
  std::_Function_base::~_Function_base((_Function_base *)(local_e8 + 0x10));
  return i;
}

Assistant:

friend std::istream& operator>>(std::istream& i, basic_json& j)
    {
        j = parser(i).parse();
        return i;
    }